

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

double SoapySDRDevice_getReferenceClockRate(SoapySDRDevice *device)

{
  long *in_RDI;
  double dVar1;
  exception *ex;
  
  SoapySDRDevice_clearError();
  dVar1 = (double)(**(code **)(*in_RDI + 600))();
  return dVar1;
}

Assistant:

double SoapySDRDevice_getReferenceClockRate(const SoapySDRDevice *device)
{
    __SOAPY_SDR_C_TRY
    return device->getReferenceClockRate();
    __SOAPY_SDR_C_CATCH_RET(NAN);
}